

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.cpp
# Opt level: O0

FSerializer * Serialize(FSerializer *arc,char *key,NumericValue *value,NumericValue *defval)

{
  EType EVar1;
  bool bVar2;
  Value *this;
  uint64_t uVar3;
  int64_t iVar4;
  double dVar5;
  Value *val;
  NumericValue *defval_local;
  NumericValue *value_local;
  char *key_local;
  FSerializer *arc_local;
  
  bVar2 = FSerializer::isWriting(arc);
  if (bVar2) {
    bVar2 = FWriter::inObject(arc->w);
    if (((!bVar2) || (defval == (NumericValue *)0x0)) ||
       (bVar2 = NumericValue::operator!=(value,defval), bVar2)) {
      FSerializer::WriteKey(arc,key);
      EVar1 = value->type;
      if (EVar1 == NM_signed) {
        FWriter::Int64(arc->w,(value->field_1).signedval);
      }
      else if (EVar1 == NM_unsigned) {
        FWriter::Uint64(arc->w,(value->field_1).signedval);
      }
      else if (EVar1 == NM_float) {
        FWriter::Double(arc->w,(value->field_1).floatval);
      }
      else {
        FWriter::Null(arc->w);
      }
    }
  }
  else {
    this = FReader::FindKey(arc->r,key);
    (value->field_1).signedval = 0;
    value->type = NM_invalid;
    if (this != (Value *)0x0) {
      bVar2 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::IsUint64(this);
      if (bVar2) {
        uVar3 = rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::GetUint64(this);
        (value->field_1).unsignedval = uVar3;
        value->type = NM_unsigned;
      }
      else {
        bVar2 = rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::IsInt64(this);
        if (bVar2) {
          iVar4 = rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::GetInt64(this);
          (value->field_1).signedval = iVar4;
          value->type = NM_signed;
        }
        else {
          bVar2 = rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::IsDouble(this);
          if (bVar2) {
            dVar5 = rapidjson::
                    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    ::GetDouble(this);
            (value->field_1).floatval = dVar5;
            value->type = NM_float;
          }
        }
      }
    }
  }
  return arc;
}

Assistant:

FSerializer &Serialize(FSerializer &arc, const char *key, NumericValue &value, NumericValue *defval)
{
	if (arc.isWriting())
	{
		if (!arc.w->inObject() || defval == nullptr || value != *defval)
		{
			arc.WriteKey(key);
			switch (value.type)
			{
			case NumericValue::NM_signed:
				arc.w->Int64(value.signedval);
				break;
			case NumericValue::NM_unsigned:
				arc.w->Uint64(value.unsignedval);
				break;
			case NumericValue::NM_float:
				arc.w->Double(value.floatval);
				break;
			default:
				arc.w->Null();
				break;
			}
		}
	}
	else
	{
		auto val = arc.r->FindKey(key);
		value.signedval = 0;
		value.type = NumericValue::NM_invalid;
		if (val != nullptr)
		{
			if (val->IsUint64())
			{
				value.unsignedval = val->GetUint64();
				value.type = NumericValue::NM_unsigned;
			}
			else if (val->IsInt64())
			{
				value.signedval = val->GetInt64();
				value.type = NumericValue::NM_signed;
			}
			else if (val->IsDouble())
			{
				value.floatval = val->GetDouble();
				value.type = NumericValue::NM_float;
			}
		}
	}
	return arc;
}